

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase960::run(TestCase960 *this)

{
  _func_int **pp_Var1;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *pRVar2;
  socklen_t in_ECX;
  undefined4 in_register_0000000c;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int in_R8D;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_3c8;
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_390;
  Maybe<capnp::MessageSize> local_350;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_338;
  undefined1 local_300 [8];
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> call1;
  Maybe<capnp::MessageSize> local_288;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_270;
  undefined1 local_238 [8];
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> call0;
  Client cap;
  Request<capnproto_test::capnp::test::TestMoreStuff::GetNullParams,_capnproto_test::capnp::test::TestMoreStuff::GetNullResults>
  local_1d0;
  undefined1 local_198 [8];
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetNullResults> promise;
  undefined1 local_150 [16];
  undefined1 local_140 [8];
  Client client;
  TestContext context;
  TestCase960 *this_local;
  
  context.rpcServer.super_RpcSystemBase.impl.ptr = (Impl *)this;
  TestContext::TestContext((TestContext *)&client.field_0x10);
  TestContext::connect((TestContext *)local_150,(int)&client.field_0x10,(sockaddr *)0x5,in_ECX);
  Capability::Client::castAs<capnproto_test::capnp::test::TestMoreStuff>
            ((Client *)local_140,(Client *)local_150);
  Capability::Client::~Client((Client *)local_150);
  kj::Maybe<capnp::MessageSize>::Maybe((Maybe<capnp::MessageSize> *)&cap.field_0x10,(void *)0x0);
  capnproto_test::capnp::test::TestMoreStuff::Client::getNullRequest
            (&local_1d0,(Client *)local_140,(Maybe<capnp::MessageSize> *)&cap.field_0x10);
  Request<capnproto_test::capnp::test::TestMoreStuff::GetNullParams,_capnproto_test::capnp::test::TestMoreStuff::GetNullResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::GetNullParams,_capnproto_test::capnp::test::TestMoreStuff::GetNullResults>
          *)local_198,(int)&local_1d0,__buf,CONCAT44(in_register_0000000c,in_ECX),in_R8D);
  Request<capnproto_test::capnp::test::TestMoreStuff::GetNullParams,_capnproto_test::capnp::test::TestMoreStuff::GetNullResults>
  ::~Request(&local_1d0);
  kj::Maybe<capnp::MessageSize>::~Maybe((Maybe<capnp::MessageSize> *)&cap.field_0x10);
  capnproto_test::capnp::test::TestMoreStuff::GetNullResults::Pipeline::getNullCap
            ((Client *)&call0.super_Pipeline._typeless.ops.disposer,
             (Pipeline *)
             &promise.
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetNullResults>_>
              .super_PromiseBase.node.ptr);
  pp_Var1 = call0.super_Pipeline._typeless.ops.disposer[-4]._vptr_ArrayDisposer;
  kj::Maybe<capnp::MessageSize>::Maybe(&local_288,(void *)0x0);
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_270,
             (Client *)((long)&call0.super_Pipeline._typeless.ops.disposer + (long)pp_Var1),
             &local_288);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)local_238,(int)&local_270,__buf_00,CONCAT44(in_register_0000000c,in_ECX),in_R8D);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::~Request(&local_270);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_288);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetNullResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetNullResults>_>
              *)&call1.super_Pipeline._typeless.ops.disposer,local_198);
  Response<capnproto_test::capnp::test::TestMoreStuff::GetNullResults>::~Response
            ((Response<capnproto_test::capnp::test::TestMoreStuff::GetNullResults> *)
             &call1.super_Pipeline._typeless.ops.disposer);
  pp_Var1 = call0.super_Pipeline._typeless.ops.disposer[-4]._vptr_ArrayDisposer;
  kj::Maybe<capnp::MessageSize>::Maybe(&local_350,(void *)0x0);
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_338,
             (Client *)((long)&call0.super_Pipeline._typeless.ops.disposer + (long)pp_Var1),
             &local_350);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)local_300,(int)&local_338,__buf_01,CONCAT44(in_register_0000000c,in_ECX),in_R8D);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::~Request(&local_338);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_350);
  pRVar2 = kj::
           mv<capnp::RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
                     ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                       *)local_238);
  (anonymous_namespace)::
  expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
            (&pRVar2->
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
             ,(WaitScope *)&context.loop.daemons.ptr);
  pRVar2 = kj::
           mv<capnp::RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
                     ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                       *)local_300);
  (anonymous_namespace)::
  expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
            (&pRVar2->
              super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
             ,(WaitScope *)&context.loop.daemons.ptr);
  getCallSequence(&local_3c8,
                  (Client *)(local_140 + (long)((Event *)((long)local_140 + -0x28))->loop),0);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_390,&local_3c8);
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
            (&local_390);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            (&local_3c8);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             local_300);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             local_238);
  capnproto_test::capnp::test::TestMoreStuff::Client::~Client
            ((Client *)&call0.super_Pipeline._typeless.ops.disposer);
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetNullResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetNullResults> *)local_198)
  ;
  capnproto_test::capnp::test::TestMoreStuff::Client::~Client((Client *)local_140);
  TestContext::~TestContext((TestContext *)&client.field_0x10);
  return;
}

Assistant:

TEST(Rpc, EmbargoNull) {
  // Set up a situation where we pipeline on a capability that ends up coming back null. This
  // should NOT cause a Disembargo to be sent, but due to a bug in earlier versions of Cap'n Proto,
  // a Disembargo was indeed sent to the null capability, which caused the server to disconnect
  // due to protocol error.

  TestContext context;

  auto client = context.connect(test::TestSturdyRefObjectId::Tag::TEST_MORE_STUFF)
      .castAs<test::TestMoreStuff>();

  auto promise = client.getNullRequest().send();

  auto cap = promise.getNullCap();

  auto call0 = cap.getCallSequenceRequest().send();

  promise.wait(context.waitScope);

  auto call1 = cap.getCallSequenceRequest().send();

  expectPromiseThrows(kj::mv(call0), context.waitScope);
  expectPromiseThrows(kj::mv(call1), context.waitScope);

  // Verify that we're still connected (there were no protocol errors).
  getCallSequence(client, 0).wait(context.waitScope);
}